

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhConsumeCellData(lhcell *pCell,_func_int_void_ptr_uint_void_ptr *xConsumer,void *pUserData)

{
  lhash_kv_engine *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  unqlite_kv_io *puVar6;
  uint uVar7;
  ulong uVar8;
  pgno pVar9;
  sxu64 sVar10;
  unqlite_page *pOvfl;
  unqlite_page *local_40;
  _func_int_void_ptr_uint_void_ptr *local_38;
  
  if (pCell->iOvfl == 0) {
    iVar4 = (*xConsumer)(pCell->pPage->pRaw->zData +
                         (ulong)(pCell->nKey + 0x1a) + (ulong)pCell->iStart,(uint)pCell->nData,
                         pUserData);
    iVar3 = -10;
    if (iVar4 == 0) {
      iVar3 = 0;
    }
  }
  else {
    sVar10 = pCell->nData;
    pVar9 = pCell->iDataPage;
    iVar3 = 0;
    if (sVar10 != 0 && pVar9 != 0) {
      plVar1 = pCell->pPage->pHash;
      bVar2 = true;
      local_38 = xConsumer;
      while (iVar3 = (*plVar1->pIo->xGet)(plVar1->pIo->pHandle,pVar9,&local_40), iVar3 == 0) {
        if (bVar2) {
          puVar5 = local_40->zData + pCell->iDataOfft;
          uVar7 = plVar1->iPageSize - (uint)pCell->iDataOfft;
        }
        else {
          puVar5 = local_40->zData + 8;
          uVar7 = plVar1->iPageSize - 8;
        }
        uVar8 = (ulong)uVar7;
        if (sVar10 < uVar8 || sVar10 - uVar8 == 0) {
          iVar3 = (*local_38)(puVar5,(uint)sVar10,pUserData);
          if (iVar3 != 0) {
            puVar6 = plVar1->pIo;
            goto LAB_00114c10;
          }
          sVar10 = 0;
        }
        else if ((uVar8 != 0) &&
                (iVar3 = (*local_38)(puVar5,uVar7,pUserData), sVar10 = sVar10 - uVar8, iVar3 != 0))
        {
          puVar6 = plVar1->pIo;
LAB_00114c10:
          (*puVar6->xPageUnref)(local_40);
          return -10;
        }
        uVar8 = *(ulong *)local_40->zData;
        pVar9 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
        (*plVar1->pIo->xPageUnref)(local_40);
        bVar2 = false;
        if (pVar9 == 0) {
          return 0;
        }
        if (sVar10 == 0) {
          return 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int lhConsumeCellData(
	lhcell *pCell, /* Target cell */
	int (*xConsumer)(const void *,unsigned int,void *), /* Data consumer callback */
	void *pUserData /* Last argument to xConsumer() */
	)
{
	lhpage *pPage = pCell->pPage;
	const unsigned char *zRaw = pPage->pRaw->zData;
	const unsigned char *zPayload;
	int rc;
	/* Point to the payload area */
	zPayload = &zRaw[pCell->iStart];
	if( pCell->iOvfl == 0 ){
		/* Best scenario, consume the data directly without any overflow page */
		zPayload += L_HASH_CELL_SZ + pCell->nKey;
		rc = xConsumer((const void *)zPayload,(sxu32)pCell->nData,pUserData);
		if( rc != UNQLITE_OK ){
			rc = UNQLITE_ABORT;
		}
	}else{
		lhash_kv_engine *pEngine = pPage->pHash;
		sxu64 nData = pCell->nData;
		unqlite_page *pOvfl;
		int fix_offset = 0;
		sxu32 nByte;
		pgno iOvfl;
		/* Overflow page where data is stored */
		iOvfl = pCell->iDataPage;
		for(;;){
			if( iOvfl == 0 || nData < 1 ){
				/* no more overflow page */
				break;
			}
			/* Point to the overflow page */
			rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,iOvfl,&pOvfl);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Point to the raw content */
			zPayload = pOvfl->zData;
			if( !fix_offset ){
				/* Point to the data */
				zPayload += pCell->iDataOfft;
				nByte = pEngine->iPageSize - pCell->iDataOfft;
				fix_offset = 1;
			}else{
				zPayload += 8;
				/* Total usable bytes in an overflow page */
				nByte = L_HASH_OVERFLOW_SIZE(pEngine->iPageSize);
			}
			/* Consume the data */
			if( nData <= (sxu64)nByte ){
				rc = xConsumer((const void *)zPayload,(unsigned int)nData,pUserData);
				if( rc != UNQLITE_OK ){
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_ABORT;
				}
				nData = 0;
			}else{
				if( nByte > 0 ){
					rc = xConsumer((const void *)zPayload,nByte,pUserData);
					if( rc != UNQLITE_OK ){
						pEngine->pIo->xPageUnref(pOvfl);
						return UNQLITE_ABORT;
					}
					nData -= nByte;
				}
			}
			/* Next overflow page in the chain */
			SyBigEndianUnpack64(pOvfl->zData,&iOvfl);
			/* Unref the page */
			pEngine->pIo->xPageUnref(pOvfl);
		}
		rc = UNQLITE_OK;
	}
	return rc;
}